

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonChain.cpp
# Opt level: O3

uint64_t __thiscall xmrig::JsonChain::getUint64(JsonChain *this,char *key,uint64_t defaultValue)

{
  pointer pGVar1;
  Number in_RAX;
  pointer name;
  undefined8 local_38;
  
  pGVar1 = (this->m_chain).
           super__Vector_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = in_RAX;
  if (pGVar1 != (this->m_chain).
                super__Vector_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    do {
      name = pGVar1 + -1;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&stack0xffffffffffffffc8,(Ch *)name);
      if ((local_38 !=
           (ulong)(name->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ).data_.s.length * 0x20 +
           ((ulong)pGVar1[-1].
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   .data_.s.str & 0xffffffffffff)) && ((*(byte *)(local_38 + 0x1f) & 1) != 0)) {
        return *(uint64_t *)(local_38 + 0x10);
      }
      pGVar1 = name;
    } while (name != (this->m_chain).
                     super__Vector_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  }
  return defaultValue;
}

Assistant:

uint64_t xmrig::JsonChain::getUint64(const char *key, uint64_t defaultValue) const
{
    for (auto it = m_chain.rbegin(); it != m_chain.rend(); ++it) {
        auto i = it->FindMember(key);
        if (i != it->MemberEnd() && i->value.IsUint64()) {
            return i->value.GetUint64();
        }
    }

    return defaultValue;
}